

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

void chunk_undo(spng_ctx *ctx)

{
  spng_unknown_chunk *psVar1;
  uint uVar2;
  
  psVar1 = ctx->chunk_list;
  uVar2 = ctx->n_chunks - 1;
  (*(ctx->alloc).free_fn)(psVar1[uVar2].data);
  decrease_cache_usage(ctx,psVar1[uVar2].length);
  if (0x1f < ctx->chunk_cache_usage) {
    ctx->chunk_cache_usage = ctx->chunk_cache_usage - 0x20;
  }
  psVar1[uVar2].data = (void *)0x0;
  ctx->n_chunks = ctx->n_chunks - 1;
  return;
}

Assistant:

static void chunk_undo(spng_ctx *ctx)
{
    struct spng_unknown_chunk *chunk = &ctx->chunk_list[ctx->n_chunks - 1];

    spng__free(ctx, chunk->data);

    decrease_cache_usage(ctx, chunk->length);
    decrease_cache_usage(ctx, sizeof(struct spng_unknown_chunk));

    chunk->data = NULL;

    ctx->n_chunks--;
}